

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p)

{
  MemPool *pMVar1;
  XMLDocument *pXVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  XMLAttribute *this_00;
  char *pcVar6;
  XMLAttribute *pXVar7;
  undefined4 extraout_var;
  XMLAttribute *pXVar8;
  uint uVar9;
  byte *p_00;
  
  pXVar8 = (XMLAttribute *)0x0;
  p_00 = (byte *)p;
  do {
    if (p_00 == (byte *)0x0) {
      return (char *)0x0;
    }
    bVar4 = *p_00;
    while ((-1 < (char)bVar4 && (iVar5 = isspace((uint)bVar4), iVar5 != 0))) {
      bVar4 = p_00[1];
      p_00 = p_00 + 1;
    }
    bVar4 = *p_00;
    if (bVar4 == 0) {
      pXVar2 = (this->super_XMLNode)._document;
      iVar5 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
      if (CONCAT44(extraout_var,iVar5) == 0) {
        pcVar6 = StrPair::GetStr(&(this->super_XMLNode)._value);
      }
      else {
        pcVar6 = (char *)0x0;
      }
      pXVar2->_errorID = XML_ERROR_PARSING_ELEMENT;
      pXVar2->_errorStr1 = p;
      pXVar2->_errorStr2 = pcVar6;
      return (char *)0x0;
    }
    if (-1 < (char)bVar4) {
      uVar9 = (uint)bVar4;
      iVar5 = isalpha(uVar9);
      if (iVar5 == 0) {
        if (uVar9 < 0x3e) {
          if (uVar9 != 0x3a) {
            if ((uVar9 == 0x2f) && (p_00[1] == 0x3e)) {
              this->_closingType = 1;
              return (char *)(p_00 + 2);
            }
LAB_001a8c4f:
            pXVar2 = (this->super_XMLNode)._document;
            pXVar2->_errorID = XML_ERROR_PARSING_ELEMENT;
            pXVar2->_errorStr1 = p;
            pXVar2->_errorStr2 = (char *)p_00;
            return (char *)0x0;
          }
        }
        else if (uVar9 != 0x5f) {
          if (uVar9 == 0x3e) {
            return (char *)(p_00 + 1);
          }
          goto LAB_001a8c4f;
        }
      }
    }
    this_00 = (XMLAttribute *)
              MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
    this_00->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_002a62f0;
    (this_00->_name)._flags = 0;
    (this_00->_name)._start = (char *)0x0;
    (this_00->_name)._end = (char *)0x0;
    (this_00->_value)._flags = 0;
    *(undefined1 (*) [32])&(this_00->_value)._start = ZEXT432(0) << 0x40;
    pXVar2 = (this->super_XMLNode)._document;
    this_00->_memPool = &(pXVar2->_attributePool).super_MemPool;
    (*(pXVar2->_attributePool).super_MemPool._vptr_MemPool[5])();
    p_00 = (byte *)XMLAttribute::ParseDeep
                             (this_00,(char *)p_00,
                              ((this->super_XMLNode)._document)->_processEntities);
    if (p_00 == (byte *)0x0) {
LAB_001a8b88:
      pMVar1 = this_00->_memPool;
      (**this_00->_vptr_XMLAttribute)(this_00);
      (*pMVar1->_vptr_MemPool[4])(pMVar1,this_00);
      pXVar2 = (this->super_XMLNode)._document;
      pXVar2->_errorID = XML_ERROR_PARSING_ATTRIBUTE;
      pXVar2->_errorStr1 = p;
      pXVar2->_errorStr2 = (char *)p_00;
      bVar3 = false;
      this_00 = pXVar8;
    }
    else {
      pcVar6 = StrPair::GetStr(&this_00->_name);
      pXVar7 = FindAttribute(this,pcVar6);
      if ((pXVar7 != (XMLAttribute *)0x0) &&
         (pcVar6 = StrPair::GetStr(&pXVar7->_value), pcVar6 != (char *)0x0)) goto LAB_001a8b88;
      if (pXVar8 == (XMLAttribute *)0x0) {
        this->_rootAttribute = this_00;
      }
      else {
        pXVar8->_next = this_00;
      }
      bVar3 = true;
    }
    pXVar8 = this_00;
    if (!bVar3) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

char* XMLElement::ParseAttributes( char* p )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
            XMLAttribute* attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
            attrib->_memPool = &_document->_attributePool;
			attrib->_memPool->SetTracked();

            p = attrib->ParseDeep( p, _document->ProcessEntities() );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                prevAttribute->_next = attrib;
            }
            else {
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p );
            return 0;
        }
    }
    return p;
}